

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::Session::useConfigData(Session *this,ConfigData *configData)

{
  Config *pCVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  ConfigData *pCVar10;
  ConfigData *pCVar11;
  
  pCVar10 = configData;
  pCVar11 = &this->m_configData;
  for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
    bVar2 = pCVar10->listTags;
    bVar3 = pCVar10->listReporters;
    bVar4 = pCVar10->listListeners;
    bVar5 = pCVar10->showSuccessfulTests;
    bVar6 = pCVar10->shouldDebugBreak;
    bVar7 = pCVar10->noThrow;
    bVar8 = pCVar10->showHelp;
    pCVar11->listTests = pCVar10->listTests;
    pCVar11->listTags = bVar2;
    pCVar11->listReporters = bVar3;
    pCVar11->listListeners = bVar4;
    pCVar11->showSuccessfulTests = bVar5;
    pCVar11->shouldDebugBreak = bVar6;
    pCVar11->noThrow = bVar7;
    pCVar11->showHelp = bVar8;
    pCVar10 = (ConfigData *)&pCVar10->showInvisibles;
    pCVar11 = (ConfigData *)&pCVar11->showInvisibles;
  }
  (this->m_configData).waitForKeypress = configData->waitForKeypress;
  std::__cxx11::string::_M_assign((string *)&(this->m_configData).defaultOutputFilename);
  std::__cxx11::string::_M_assign((string *)&(this->m_configData).name);
  std::__cxx11::string::_M_assign((string *)&(this->m_configData).processName);
  std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::operator=
            (&(this->m_configData).reporterSpecifications,&configData->reporterSpecifications);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->m_configData).testsOrTags,&configData->testsOrTags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->m_configData).sectionsToRun,&configData->sectionsToRun);
  pCVar1 = (this->m_config).m_ptr;
  if (pCVar1 != (Config *)0x0) {
    (*(pCVar1->super_IConfig)._vptr_IConfig[1])();
  }
  (this->m_config).m_ptr = (Config *)0x0;
  return;
}

Assistant:

void Session::useConfigData( ConfigData const& configData ) {
        m_configData = configData;
        m_config.reset();
    }